

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::cleanup_auto_fwd_pkgs(raft_server *this)

{
  _List_node_base *this_00;
  element_type *peVar1;
  int iVar2;
  long lVar3;
  _Hash_node_base *p_Var4;
  _List_node_base *p_Var5;
  string local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->rpc_clients_lock_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  p_Var4 = (this->auto_fwd_pkgs_)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      this_00 = (_List_node_base *)p_Var4[2]._M_nxt;
      local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[3]._M_nxt;
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_38->_M_use_count = local_38->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_38->_M_use_count = local_38->_M_use_count + 1;
        }
      }
      EventAwaiter::invoke((EventAwaiter *)&this_00[7]._M_prev);
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this_00 + 5));
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar2 = (*peVar1->_vptr_logger[7])();
        if (3 < iVar2) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_58,"srv %d, in-use %zu, idle %zu",(ulong)*(uint *)&p_Var4[1]._M_nxt,
                     this_00[3]._M_next,this_00[1]._M_next);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"cleanup_auto_fwd_pkgs",0x16d,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
      }
      for (p_Var5 = this_00[2]._M_prev; p_Var5 != (_List_node_base *)0x0; p_Var5 = p_Var5->_M_next)
      {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar2 = (*peVar1->_vptr_logger[7])();
          if (5 < iVar2) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (p_Var5[1]._M_next == (_List_node_base *)0x0) {
              lVar3 = 0;
            }
            else {
              lVar3 = (long)*(int *)&(p_Var5[1]._M_next)->_M_prev;
            }
            msg_if_given_abi_cxx11_(&local_58,"use count %zu",lVar3);
            (*peVar1->_vptr_logger[8])
                      (peVar1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"cleanup_auto_fwd_pkgs",0x16f,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
        }
      }
      for (p_Var5 = (((_List_impl *)&this_00->_M_next)->_M_node).super__List_node_base._M_next;
          p_Var5 != this_00;
          p_Var5 = (((_List_impl *)&p_Var5->_M_next)->_M_node).super__List_node_base._M_next) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar2 = (*peVar1->_vptr_logger[7])();
          if (5 < iVar2) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (p_Var5[1]._M_prev == (_List_node_base *)0x0) {
              lVar3 = 0;
            }
            else {
              lVar3 = (long)*(int *)&(p_Var5[1]._M_prev)->_M_prev;
            }
            msg_if_given_abi_cxx11_(&local_58,"use count %zu",lVar3);
            (*peVar1->_vptr_logger[8])
                      (peVar1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"cleanup_auto_fwd_pkgs",0x172,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
          }
        }
      }
      std::__cxx11::
      _List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
      ::_M_clear((_List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                  *)this_00);
      this_00->_M_prev = this_00;
      (((_List_impl *)&this_00->_M_next)->_M_node).super__List_node_base._M_next = this_00;
      this_00[1]._M_next = (_List_node_base *)0x0;
      std::
      _Hashtable<std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)&this_00[1]._M_prev);
      pthread_mutex_unlock((pthread_mutex_t *)(this_00 + 5));
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->auto_fwd_pkgs_)._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_clients_lock_);
  return;
}

Assistant:

void raft_server::cleanup_auto_fwd_pkgs() {
    auto_lock(rpc_clients_lock_);
    for (auto& entry: auto_fwd_pkgs_) {
        ptr<auto_fwd_pkg> pkg = entry.second;
        pkg->ea_.invoke();
        auto_lock(pkg->lock_);
        p_in("srv %d, in-use %zu, idle %zu",
             entry.first,
             pkg->rpc_client_in_use_.size(),
             pkg->rpc_client_idle_.size());
        for (auto& ee: pkg->rpc_client_in_use_) {
            p_tr("use count %zu", ee.use_count());
        }
        for (auto& ee: pkg->rpc_client_idle_) {
            p_tr("use count %zu", ee.use_count());
        }
        pkg->rpc_client_idle_.clear();
        pkg->rpc_client_in_use_.clear();
    }
    auto_fwd_pkgs_.clear();
}